

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void vkt::anon_unknown_0::renderReferenceValues
               (vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                *referenceAttachments,RenderPass *renderPassInfo,UVec2 *targetSize,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *imageClearValues,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *renderPassClearValues,
               vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
               *subpassRenderInfo,UVec2 *renderPos,UVec2 *renderSize)

{
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *pvVar1;
  undefined8 uVar2;
  Subpass *pSVar3;
  bool bVar4;
  bool bVar5;
  VkFormat VVar6;
  uint uVar7;
  uint uVar8;
  VkAttachmentLoadOp VVar9;
  deUint32 dVar10;
  deInt32 dVar11;
  deInt32 dVar12;
  BoolOp BVar13;
  int iVar14;
  VkAttachmentStoreOp VVar15;
  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
  *pvVar16;
  size_type sVar17;
  const_reference pvVar18;
  reference pvVar19;
  const_reference pvVar20;
  VkClearValue *pVVar21;
  Subpass *pSVar22;
  const_reference pvVar23;
  AttachmentReference *pAVar24;
  vector<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
  *pvVar25;
  ColorClear *pCVar26;
  const_reference this;
  UVec2 *pUVar27;
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  *pvVar28;
  VkClearColorValue *pVVar29;
  Maybe<vkt::(anonymous_namespace)::DepthStencilClear> *pMVar30;
  DepthStencilClear *this_00;
  Maybe<vkt::(anonymous_namespace)::RenderQuad> *pMVar31;
  RenderQuad *this_01;
  Vec2 *pVVar32;
  size_t sVar33;
  byte *index_00;
  TextureFormat TVar34;
  reference pvVar35;
  pointer pMVar36;
  ulong uVar37;
  reference pvVar38;
  bool *pbVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  reference rVar43;
  byte local_9cb;
  ulong local_878;
  Vector<bool,_4> local_53c;
  reference local_538;
  Vector<bool,_4> local_528;
  Vector<bool,_4> local_524;
  reference local_520;
  byte local_50a;
  byte local_509;
  bool isDepthOrStencilAttachment;
  reference pvStack_508;
  bool isStencilAttachment;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference_10;
  TextureFormat format_11;
  Attachment attachment_11;
  size_t attachmentIndex_11;
  size_t index_5;
  int x_3;
  int y_3;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference_9;
  TextureFormat format_10;
  Attachment *attachment_10;
  undefined1 local_4a0 [4];
  deUint32 attachmentIndex_10;
  bool local_489;
  ulong local_488;
  size_t i_1;
  undefined1 local_478 [8];
  Maybe<bool> output_1;
  bool boolY_3;
  uint uStack_460;
  bool boolX_3;
  BoolOp op_3;
  size_t index_4;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference_8;
  deUint32 attachmentIndex_9;
  ulong local_438;
  size_t i;
  undefined1 local_428 [8];
  Maybe<bool> output;
  bool boolY_2;
  uint uStack_410;
  bool boolX_2;
  BoolOp op_2;
  size_t index_3;
  int compNdx_2;
  int componentCount_2;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference_7;
  TextureFormat format_9;
  Attachment *attachment_9;
  ulong uStack_3e0;
  deUint32 attachmentIndex_8;
  size_t attachmentRefNdx_2;
  size_t outputValueNdx;
  size_t inputsPerOutput;
  int local_3b8;
  int local_3b4;
  int compNdx_1;
  int componentCount_1;
  TextureFormat format_8;
  Attachment *attachment_8;
  ulong uStack_398;
  deUint32 attachmentIndex_7;
  size_t inputAttachmentNdx;
  int local_388;
  int x_2;
  int y_2;
  int componentCount;
  TextureFormat format_7;
  Attachment *attachment_7;
  ulong uStack_368;
  deUint32 attachmentIndex_6;
  size_t attachmentRefNdx_1;
  vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_> inputs;
  size_t outputComponentCount;
  size_t index_2;
  bool boolY_1;
  uint uStack_330;
  bool boolX_1;
  BoolOp op_1;
  size_t index_1;
  int x_1;
  int y_1;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference_6;
  TextureFormat format_6;
  Attachment *attachment_6;
  deUint32 attachmentIndex_5;
  bool boolY;
  bool boolX;
  BoolOp op;
  size_t index;
  int local_2e8;
  int compNdx;
  int x;
  int y;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference_5;
  TextureFormat TStack_2d0;
  BVec4 channelMask;
  TextureFormat format_5;
  Attachment *attachment_5;
  ulong uStack_2b8;
  deUint32 attachmentIndex_4;
  size_t attachmentRefNdx;
  IVec2 posBI;
  IVec2 posAI;
  Vector<float,_2> local_298;
  Vector<float,_2> local_290;
  Vec2 p;
  Vector<float,_2> local_280;
  Vector<float,_2> local_278;
  Vector<float,_2> local_270;
  Vector<float,_2> local_268;
  Vec2 origin;
  Vec2 posB;
  Vec2 posA;
  RenderQuad *renderQuad;
  undefined1 local_240 [8];
  VkClearValue value_1;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference_4;
  ChannelOrder CStack_220;
  bool hasDepth;
  bool hasStencil;
  TextureFormat format_4;
  Attachment *attachment_4;
  deUint32 attachmentIndex_3;
  UVec2 size_1;
  UVec2 offset_1;
  DepthStencilClear *dsClear;
  undefined1 auStack_1e8 [8];
  VkClearValue value;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference_3;
  TextureFormat format_3;
  Attachment *attachment_3;
  deUint32 attachmentIndex_2;
  UVec2 size;
  UVec2 offset;
  ColorClear *colorClear;
  size_t colorClearNdx;
  _Bit_type local_190;
  Vector<bool,_4> local_184;
  PixelValue local_180;
  Vector<bool,_4> local_17e;
  Vector<bool,_4> local_17a;
  PixelValue local_176;
  Vector<bool,_4> local_174;
  TextureFormat local_170;
  TextureFormat format_2;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference_2;
  Attachment *attachment_2;
  _Bit_type local_150;
  deUint32 local_144;
  undefined1 auStack_140 [4];
  deUint32 attachmentIndex_1;
  _Bit_type local_138;
  Vector<bool,_4> local_12a;
  PixelValue local_126;
  Vector<bool,_4> local_124;
  TextureFormat local_120;
  TextureFormat format_1;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference_1;
  Attachment *attachment_1;
  _Bit_type local_100;
  deUint32 local_f4;
  ulong uStack_f0;
  deUint32 attachmentIndex;
  size_t attachmentNdx_1;
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  *colorAttachments;
  SubpassRenderInfo *renderInfo;
  Subpass *subpass;
  size_t subpassNdx;
  Vector<unsigned_int,_2> local_c0;
  reference local_b8;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference;
  TextureFormat format;
  Attachment attachment;
  size_t attachmentNdx;
  allocator<bool> local_6a;
  bool local_69;
  undefined1 local_68 [8];
  vector<bool,_std::allocator<bool>_> attachmentUsed;
  vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
  *subpasses;
  vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
  *subpassRenderInfo_local;
  vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
  *renderPassClearValues_local;
  vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
  *imageClearValues_local;
  UVec2 *targetSize_local;
  RenderPass *renderPassInfo_local;
  vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  *referenceAttachments_local;
  
  attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)RenderPass::getSubpasses(renderPassInfo);
  pvVar16 = RenderPass::getAttachments(renderPassInfo);
  sVar17 = std::
           vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
           ::size(pvVar16);
  local_69 = false;
  std::allocator<bool>::allocator(&local_6a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_68,sVar17,&local_69,&local_6a);
  std::allocator<bool>::~allocator(&local_6a);
  pvVar16 = RenderPass::getAttachments(renderPassInfo);
  sVar17 = std::
           vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
           ::size(pvVar16);
  std::
  vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ::resize(referenceAttachments,sVar17);
  attachment.m_initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  attachment.m_finalLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  while( true ) {
    pvVar16 = RenderPass::getAttachments(renderPassInfo);
    sVar17 = std::
             vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
             ::size(pvVar16);
    if (sVar17 <= (ulong)attachment._24_8_) break;
    pvVar16 = RenderPass::getAttachments(renderPassInfo);
    pvVar18 = std::
              vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
              ::operator[](pvVar16,attachment._24_8_);
    format.order = pvVar18->m_format;
    format.type = pvVar18->m_samples;
    VVar6 = Attachment::getFormat((Attachment *)&format);
    reference = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                 *)::vk::mapVkFormat(VVar6);
    pvVar19 = std::
              vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
              ::operator[](referenceAttachments,attachment._24_8_);
    local_b8 = pvVar19;
    uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
    uVar8 = tcu::Vector<unsigned_int,_2>::y(targetSize);
    std::
    vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
    ::resize(pvVar19,(ulong)(uVar7 * uVar8));
    pvVar20 = std::
              vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>::
              operator[](imageClearValues,attachment._24_8_);
    bVar4 = tcu::Maybe::operator_cast_to_bool((Maybe *)pvVar20);
    pvVar19 = local_b8;
    if (bVar4) {
      tcu::Vector<unsigned_int,_2>::Vector(&local_c0,0,0);
      tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)((long)&subpassNdx + 4),true);
      pvVar20 = std::
                vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                ::operator[](imageClearValues,attachment._24_8_);
      pVVar21 = tcu::Maybe<vk::VkClearValue>::operator*(pvVar20);
      subpassNdx._2_2_ = clearValueToPixelValue(pVVar21,(TextureFormat *)&reference);
      clearReferenceValues
                (pvVar19,targetSize,&local_c0,targetSize,(BVec4 *)((long)&subpassNdx + 4),
                 (PixelValue *)((long)&subpassNdx + 2));
    }
    attachment._24_8_ = attachment._24_8_ + 1;
  }
  subpass = (Subpass *)0x0;
  do {
    pSVar3 = subpass;
    pSVar22 = (Subpass *)
              std::
              vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
              ::size((vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                      *)attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
    if (pSVar22 <= pSVar3) {
      attachment_11.m_initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      attachment_11.m_finalLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      while( true ) {
        pvVar16 = RenderPass::getAttachments(renderPassInfo);
        sVar17 = std::
                 vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                 ::size(pvVar16);
        if (sVar17 <= (ulong)attachment_11._24_8_) break;
        pvVar16 = RenderPass::getAttachments(renderPassInfo);
        pvVar18 = std::
                  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ::operator[](pvVar16,attachment_11._24_8_);
        format_11.order = pvVar18->m_format;
        format_11.type = pvVar18->m_samples;
        VVar6 = Attachment::getFormat((Attachment *)&format_11);
        reference_10 = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                        *)::vk::mapVkFormat(VVar6);
        pvStack_508 = std::
                      vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ::operator[](referenceAttachments,attachment_11._24_8_);
        local_509 = tcu::hasStencilComponent((ChannelOrder)reference_10);
        bVar4 = tcu::hasDepthComponent((ChannelOrder)reference_10);
        local_9cb = 1;
        if (!bVar4) {
          local_9cb = local_509;
        }
        local_50a = local_9cb & 1;
        rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_68,attachment_11._24_8_);
        local_520 = rVar43;
        bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_520);
        bVar4 = false;
        if (bVar5) {
          pvVar16 = RenderPass::getAttachments(renderPassInfo);
          pvVar18 = std::
                    vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ::operator[](pvVar16,attachment_11._24_8_);
          VVar15 = Attachment::getStoreOp(pvVar18);
          bVar4 = VVar15 == VK_ATTACHMENT_STORE_OP_DONT_CARE;
        }
        pvVar1 = pvStack_508;
        if (bVar4) {
          if ((local_50a & 1) == 0) {
            tcu::Vector<bool,_4>::Vector(&local_528,true);
            markUndefined(pvVar1,&local_528,targetSize,renderPos,renderSize);
          }
          else {
            tcu::Vector<bool,_4>::Vector(&local_524,true,false,false,false);
            markUndefined(pvVar1,&local_524,targetSize,renderPos,renderSize);
          }
        }
        rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_68,attachment_11._24_8_);
        local_538 = rVar43;
        bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_538);
        bVar4 = false;
        if ((bVar5) && (bVar4 = false, (local_509 & 1) != 0)) {
          pvVar16 = RenderPass::getAttachments(renderPassInfo);
          pvVar18 = std::
                    vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ::operator[](pvVar16,attachment_11._24_8_);
          VVar15 = Attachment::getStencilStoreOp(pvVar18);
          bVar4 = VVar15 == VK_ATTACHMENT_STORE_OP_DONT_CARE;
        }
        pvVar1 = pvStack_508;
        if (bVar4) {
          tcu::Vector<bool,_4>::Vector(&local_53c,false,true,false,false);
          markUndefined(pvVar1,&local_53c,targetSize,renderPos,renderSize);
        }
        attachment_11._24_8_ = attachment_11._24_8_ + 1;
      }
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_68);
      return;
    }
    renderInfo = (SubpassRenderInfo *)
                 std::
                 vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                 ::operator[]((vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                               *)attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage,(size_type)subpass);
    colorAttachments =
         (vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          *)std::
            vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
            ::operator[](subpassRenderInfo,(size_type)subpass);
    attachmentNdx_1 = (size_t)Subpass::getColorAttachments((Subpass *)renderInfo);
    uStack_f0 = 0;
    while( true ) {
      uVar37 = uStack_f0;
      sVar17 = std::
               vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
               ::size((vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                       *)attachmentNdx_1);
      if (sVar17 <= uVar37) break;
      pvVar23 = std::
                vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                ::operator[]((vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                              *)attachmentNdx_1,uStack_f0);
      local_f4 = AttachmentReference::getAttachment(pvVar23);
      rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_68,(ulong)local_f4);
      local_100 = rVar43._M_mask;
      attachment_1 = (Attachment *)rVar43._M_p;
      bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&attachment_1);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        pvVar16 = RenderPass::getAttachments(renderPassInfo);
        pvVar18 = std::
                  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ::operator[](pvVar16,(ulong)local_f4);
        format_1 = (TextureFormat)
                   std::
                   vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                   ::operator[](referenceAttachments,(ulong)local_f4);
        VVar6 = Attachment::getFormat(pvVar18);
        local_120 = ::vk::mapVkFormat(VVar6);
        VVar9 = Attachment::getLoadOp(pvVar18);
        TVar34 = format_1;
        if (VVar9 == VK_ATTACHMENT_LOAD_OP_CLEAR) {
          tcu::Vector<bool,_4>::Vector(&local_124,true);
          pvVar20 = std::
                    vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                    ::operator[](renderPassClearValues,(ulong)local_f4);
          pVVar21 = tcu::Maybe<vk::VkClearValue>::operator*(pvVar20);
          local_126 = clearValueToPixelValue(pVVar21,&local_120);
          clearReferenceValues
                    ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                      *)TVar34,targetSize,renderPos,renderSize,&local_124,&local_126);
        }
        else {
          VVar9 = Attachment::getLoadOp(pvVar18);
          TVar34 = format_1;
          if (VVar9 == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
            tcu::Vector<bool,_4>::Vector(&local_12a,true);
            markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                           *)TVar34,&local_12a,targetSize,renderPos,renderSize);
          }
        }
        rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_68,(ulong)local_f4);
        _auStack_140 = rVar43;
        std::_Bit_reference::operator=((_Bit_reference *)auStack_140,true);
      }
      uStack_f0 = uStack_f0 + 1;
    }
    pAVar24 = Subpass::getDepthStencilAttachment((Subpass *)renderInfo);
    dVar10 = AttachmentReference::getAttachment(pAVar24);
    if (dVar10 != 0xffffffff) {
      pAVar24 = Subpass::getDepthStencilAttachment((Subpass *)renderInfo);
      local_144 = AttachmentReference::getAttachment(pAVar24);
      rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_68,(ulong)local_144);
      local_150 = rVar43._M_mask;
      attachment_2 = (Attachment *)rVar43._M_p;
      bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&attachment_2);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        pvVar16 = RenderPass::getAttachments(renderPassInfo);
        pvVar18 = std::
                  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ::operator[](pvVar16,(ulong)local_144);
        format_2 = (TextureFormat)
                   std::
                   vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                   ::operator[](referenceAttachments,(ulong)local_144);
        VVar6 = Attachment::getFormat(pvVar18);
        local_170 = ::vk::mapVkFormat(VVar6);
        bVar4 = tcu::hasDepthComponent(local_170.order);
        if (bVar4) {
          VVar9 = Attachment::getLoadOp(pvVar18);
          TVar34 = format_2;
          if (VVar9 == VK_ATTACHMENT_LOAD_OP_CLEAR) {
            tcu::Vector<bool,_4>::Vector(&local_174,true,false,false,false);
            pvVar20 = std::
                      vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                      ::operator[](renderPassClearValues,(ulong)local_144);
            pVVar21 = tcu::Maybe<vk::VkClearValue>::operator*(pvVar20);
            local_176 = clearValueToPixelValue(pVVar21,&local_170);
            clearReferenceValues
                      ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                        *)TVar34,targetSize,renderPos,renderSize,&local_174,&local_176);
          }
          else {
            VVar9 = Attachment::getLoadOp(pvVar18);
            TVar34 = format_2;
            if (VVar9 == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
              tcu::Vector<bool,_4>::Vector(&local_17a,true,false,false,false);
              markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                             *)TVar34,&local_17a,targetSize,renderPos,renderSize);
            }
          }
        }
        bVar4 = tcu::hasStencilComponent(local_170.order);
        if (bVar4) {
          VVar9 = Attachment::getStencilLoadOp(pvVar18);
          TVar34 = format_2;
          if (VVar9 == VK_ATTACHMENT_LOAD_OP_CLEAR) {
            tcu::Vector<bool,_4>::Vector(&local_17e,false,true,false,false);
            pvVar20 = std::
                      vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                      ::operator[](renderPassClearValues,(ulong)local_144);
            pVVar21 = tcu::Maybe<vk::VkClearValue>::operator*(pvVar20);
            local_180 = clearValueToPixelValue(pVVar21,&local_170);
            clearReferenceValues
                      ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                        *)TVar34,targetSize,renderPos,renderSize,&local_17e,&local_180);
          }
          else {
            VVar9 = Attachment::getStencilLoadOp(pvVar18);
            TVar34 = format_2;
            if (VVar9 == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
              tcu::Vector<bool,_4>::Vector(&local_184,false,true,false,false);
              markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                             *)TVar34,&local_184,targetSize,renderPos,renderSize);
            }
          }
        }
        rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_68,(ulong)local_144);
        local_190 = rVar43._M_mask;
        colorClearNdx = (size_t)rVar43._M_p;
        std::_Bit_reference::operator=((_Bit_reference *)&colorClearNdx,true);
      }
    }
    colorClear = (ColorClear *)0x0;
    while( true ) {
      pvVar25 = SubpassRenderInfo::getColorClears((SubpassRenderInfo *)colorAttachments);
      pCVar26 = (ColorClear *)
                std::
                vector<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
                ::size(pvVar25);
      if (pCVar26 <= colorClear) break;
      pvVar25 = SubpassRenderInfo::getColorClears((SubpassRenderInfo *)colorAttachments);
      this = std::
             vector<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
             ::operator[](pvVar25,(size_type)colorClear);
      pUVar27 = ColorClear::getOffset(this);
      tcu::Vector<unsigned_int,_2>::Vector(&size,pUVar27);
      pUVar27 = ColorClear::getSize(this);
      tcu::Vector<unsigned_int,_2>::Vector
                ((Vector<unsigned_int,_2> *)&stack0xfffffffffffffe48,pUVar27);
      pvVar28 = Subpass::getColorAttachments((Subpass *)renderInfo);
      pvVar23 = std::
                vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                ::operator[](pvVar28,(size_type)colorClear);
      dVar10 = AttachmentReference::getAttachment(pvVar23);
      pvVar16 = RenderPass::getAttachments(renderPassInfo);
      format_3 = (TextureFormat)
                 std::
                 vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                 ::operator[](pvVar16,(ulong)dVar10);
      VVar6 = Attachment::getFormat((Attachment *)format_3);
      reference_3 = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                     *)::vk::mapVkFormat(VVar6);
      value._8_8_ = std::
                    vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ::operator[](referenceAttachments,(ulong)dVar10);
      pVVar29 = ColorClear::getColor(this);
      uVar2 = value._8_8_;
      auStack_1e8 = *(undefined1 (*) [8])pVVar29;
      value.depthStencil = *(VkClearDepthStencilValue *)(pVVar29->float32 + 2);
      tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)((long)&dsClear + 4),true);
      dsClear._2_2_ =
           clearValueToPixelValue((VkClearValue *)auStack_1e8,(TextureFormat *)&reference_3);
      clearReferenceValues
                ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                  *)uVar2,targetSize,&size,(UVec2 *)&stack0xfffffffffffffe48,
                 (BVec4 *)((long)&dsClear + 4),(PixelValue *)((long)&dsClear + 2));
      colorClear = (ColorClear *)((long)(colorClear->m_offset).m_data + 1);
    }
    pMVar30 = SubpassRenderInfo::getDepthStencilClear((SubpassRenderInfo *)colorAttachments);
    bVar4 = tcu::Maybe::operator_cast_to_bool((Maybe *)pMVar30);
    if (bVar4) {
      pMVar30 = SubpassRenderInfo::getDepthStencilClear((SubpassRenderInfo *)colorAttachments);
      this_00 = tcu::Maybe<vkt::(anonymous_namespace)::DepthStencilClear>::operator*(pMVar30);
      pUVar27 = DepthStencilClear::getOffset(this_00);
      tcu::Vector<unsigned_int,_2>::Vector(&size_1,pUVar27);
      pUVar27 = DepthStencilClear::getSize(this_00);
      tcu::Vector<unsigned_int,_2>::Vector
                ((Vector<unsigned_int,_2> *)&stack0xfffffffffffffdf8,pUVar27);
      pAVar24 = Subpass::getDepthStencilAttachment((Subpass *)renderInfo);
      dVar10 = AttachmentReference::getAttachment(pAVar24);
      pvVar16 = RenderPass::getAttachments(renderPassInfo);
      format_4 = (TextureFormat)
                 std::
                 vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                 ::operator[](pvVar16,(ulong)dVar10);
      VVar6 = Attachment::getFormat((Attachment *)format_4);
      _CStack_220 = ::vk::mapVkFormat(VVar6);
      reference_4._7_1_ = tcu::hasStencilComponent(CStack_220);
      reference_4._6_1_ = tcu::hasDepthComponent(CStack_220);
      value_1._8_8_ =
           std::
           vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
           ::operator[](referenceAttachments,(ulong)dVar10);
      local_240._0_4_ = DepthStencilClear::getDepth(this_00);
      local_240._4_4_ = DepthStencilClear::getStencil(this_00);
      uVar2 = value_1._8_8_;
      tcu::Vector<bool,_4>::Vector
                ((Vector<bool,_4> *)((long)&renderQuad + 4),(bool)(reference_4._6_1_ & 1),
                 (bool)(reference_4._7_1_ & 1),false,false);
      renderQuad._2_2_ =
           clearValueToPixelValue
                     ((VkClearValue *)local_240,(TextureFormat *)&stack0xfffffffffffffde0);
      clearReferenceValues
                ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                  *)uVar2,targetSize,&size_1,(UVec2 *)&stack0xfffffffffffffdf8,
                 (BVec4 *)((long)&renderQuad + 4),(PixelValue *)((long)&renderQuad + 2));
    }
    pMVar31 = SubpassRenderInfo::getRenderQuad((SubpassRenderInfo *)colorAttachments);
    bVar4 = tcu::Maybe::operator_cast_to_bool((Maybe *)pMVar31);
    if (bVar4) {
      pMVar31 = SubpassRenderInfo::getRenderQuad((SubpassRenderInfo *)colorAttachments);
      this_01 = tcu::Maybe<vkt::(anonymous_namespace)::RenderQuad>::operator*(pMVar31);
      pVVar32 = RenderQuad::getCornerA(this_01);
      tcu::Vector<float,_2>::Vector(&posB,pVVar32);
      pVVar32 = RenderQuad::getCornerB(this_01);
      tcu::Vector<float,_2>::Vector(&origin,pVVar32);
      pUVar27 = SubpassRenderInfo::getViewportOffset((SubpassRenderInfo *)colorAttachments);
      uVar7 = tcu::Vector<unsigned_int,_2>::x(pUVar27);
      pUVar27 = SubpassRenderInfo::getViewportOffset((SubpassRenderInfo *)colorAttachments);
      uVar8 = tcu::Vector<unsigned_int,_2>::y(pUVar27);
      tcu::Vector<float,_2>::Vector(&local_270,(float)uVar7,(float)uVar8);
      pUVar27 = SubpassRenderInfo::getViewportSize((SubpassRenderInfo *)colorAttachments);
      uVar7 = tcu::Vector<unsigned_int,_2>::x(pUVar27);
      pUVar27 = SubpassRenderInfo::getViewportSize((SubpassRenderInfo *)colorAttachments);
      uVar8 = tcu::Vector<unsigned_int,_2>::y(pUVar27);
      tcu::Vector<float,_2>::Vector(&local_280,(float)uVar7,(float)uVar8);
      tcu::Vector<float,_2>::Vector(&p,2.0);
      tcu::operator/((tcu *)&local_278,&local_280,&p);
      tcu::operator+((tcu *)&local_268,&local_270,&local_278);
      pUVar27 = SubpassRenderInfo::getViewportSize((SubpassRenderInfo *)colorAttachments);
      uVar7 = tcu::Vector<unsigned_int,_2>::x(pUVar27);
      pUVar27 = SubpassRenderInfo::getViewportSize((SubpassRenderInfo *)colorAttachments);
      uVar8 = tcu::Vector<unsigned_int,_2>::y(pUVar27);
      tcu::Vector<float,_2>::Vector(&local_298,(float)uVar7,(float)uVar8);
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&posAI,2.0);
      tcu::operator/((tcu *)&local_290,&local_298,(Vector<float,_2> *)&posAI);
      fVar40 = tcu::Vector<float,_2>::x(&local_268);
      fVar41 = tcu::Vector<float,_2>::x(&local_290);
      fVar42 = tcu::Vector<float,_2>::x(&posB);
      dVar11 = deRoundFloatToInt32(fVar41 * fVar42 + fVar40);
      fVar40 = tcu::Vector<float,_2>::y(&local_268);
      fVar41 = tcu::Vector<float,_2>::y(&local_290);
      fVar42 = tcu::Vector<float,_2>::y(&posB);
      dVar12 = deRoundFloatToInt32(fVar41 * fVar42 + fVar40);
      tcu::Vector<int,_2>::Vector(&posBI,dVar11,dVar12);
      fVar40 = tcu::Vector<float,_2>::x(&local_268);
      fVar41 = tcu::Vector<float,_2>::x(&local_290);
      fVar42 = tcu::Vector<float,_2>::x(&origin);
      dVar11 = deRoundFloatToInt32(fVar41 * fVar42 + fVar40);
      fVar40 = tcu::Vector<float,_2>::y(&local_268);
      fVar41 = tcu::Vector<float,_2>::y(&local_290);
      fVar42 = tcu::Vector<float,_2>::y(&origin);
      dVar12 = deRoundFloatToInt32(fVar41 * fVar42 + fVar40);
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&attachmentRefNdx,dVar11,dVar12);
      pvVar28 = Subpass::getInputAttachments((Subpass *)renderInfo);
      bVar4 = std::
              vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
              ::empty(pvVar28);
      if (bVar4) {
        uStack_2b8 = 0;
        while( true ) {
          pvVar28 = Subpass::getColorAttachments((Subpass *)renderInfo);
          sVar17 = std::
                   vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                   ::size(pvVar28);
          if (sVar17 <= uStack_2b8) break;
          pvVar28 = Subpass::getColorAttachments((Subpass *)renderInfo);
          pvVar23 = std::
                    vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                    ::operator[](pvVar28,uStack_2b8);
          dVar10 = AttachmentReference::getAttachment(pvVar23);
          pvVar16 = RenderPass::getAttachments(renderPassInfo);
          pvVar18 = std::
                    vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ::operator[](pvVar16,(ulong)dVar10);
          VVar6 = Attachment::getFormat(pvVar18);
          TStack_2d0 = ::vk::mapVkFormat(VVar6);
          tcu::getTextureFormatChannelMask((tcu *)((long)&reference_5 + 4),&stack0xfffffffffffffd30)
          ;
          pvVar19 = std::
                    vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ::operator[](referenceAttachments,(ulong)dVar10);
          compNdx = tcu::Vector<int,_2>::y(&posBI);
          while( true ) {
            iVar14 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&attachmentRefNdx);
            if (iVar14 <= compNdx) break;
            local_2e8 = tcu::Vector<int,_2>::x(&posBI);
            while( true ) {
              iVar14 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&attachmentRefNdx);
              if (iVar14 <= local_2e8) break;
              for (index._4_4_ = 0; index._4_4_ < 4; index._4_4_ = index._4_4_ + 1) {
                sVar33 = (long)&subpass->m_pipelineBindPoint + (long)index._4_4_ + (ulong)dVar10;
                BVar13 = boolOpFromIndex(sVar33);
                pbVar39 = tcu::Vector<bool,_4>::operator[]
                                    ((Vector<bool,_4> *)((long)&reference_5 + 4),index._4_4_);
                if ((*pbVar39 & 1U) != 0) {
                  uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
                  pvVar35 = std::
                            vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                            ::operator[](pvVar19,(ulong)(local_2e8 + compNdx * uVar7));
                  bVar4 = performBoolOp(BVar13,local_2e8 % 2 == ((uint)sVar33 & 1),
                                        compNdx % 2 == ((uint)(sVar33 >> 1) & 1));
                  PixelValue::setValue(pvVar35,(long)index._4_4_,bVar4);
                }
              }
              local_2e8 = local_2e8 + 1;
            }
            compNdx = compNdx + 1;
          }
          uStack_2b8 = uStack_2b8 + 1;
        }
        pAVar24 = Subpass::getDepthStencilAttachment((Subpass *)renderInfo);
        dVar10 = AttachmentReference::getAttachment(pAVar24);
        if (dVar10 != 0xffffffff) {
          pAVar24 = Subpass::getDepthStencilAttachment((Subpass *)renderInfo);
          dVar10 = AttachmentReference::getAttachment(pAVar24);
          pvVar16 = RenderPass::getAttachments(renderPassInfo);
          pvVar18 = std::
                    vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ::operator[](pvVar16,(ulong)dVar10);
          VVar6 = Attachment::getFormat(pvVar18);
          TVar34 = ::vk::mapVkFormat(VVar6);
          pvVar19 = std::
                    vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ::operator[](referenceAttachments,(ulong)dVar10);
          index_1._4_4_ = tcu::Vector<int,_2>::y(&posBI);
          while( true ) {
            iVar14 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&attachmentRefNdx);
            if (iVar14 <= index_1._4_4_) break;
            index_1._0_4_ = tcu::Vector<int,_2>::x(&posBI);
            while( true ) {
              iVar14 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&attachmentRefNdx);
              if (iVar14 <= (int)index_1) break;
              reference_6._0_4_ = TVar34.order;
              bVar4 = tcu::hasDepthComponent((ChannelOrder)reference_6);
              if (bVar4) {
                index_00 = (byte *)((long)&subpass->m_pipelineBindPoint + 1);
                BVar13 = boolOpFromIndex((size_t)index_00);
                uStack_330 = (uint)index_00;
                uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
                pvVar35 = std::
                          vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          ::operator[](pvVar19,(ulong)((int)index_1 + index_1._4_4_ * uVar7));
                bVar4 = performBoolOp(BVar13,(int)index_1 % 2 == (uStack_330 & 1),
                                      index_1._4_4_ % 2 == (uint)((uStack_330 >> 1 & 1) != 0));
                PixelValue::setValue(pvVar35,0,bVar4);
              }
              bVar4 = tcu::hasStencilComponent((ChannelOrder)reference_6);
              pSVar3 = subpass;
              if (bVar4) {
                uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
                pvVar35 = std::
                          vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          ::operator[](pvVar19,(ulong)((int)index_1 + index_1._4_4_ * uVar7));
                PixelValue::setValue(pvVar35,1,((ulong)pSVar3 & 1) == 0);
              }
              index_1._0_4_ = (int)index_1 + 1;
            }
            index_1._4_4_ = index_1._4_4_ + 1;
          }
        }
      }
      else {
        inputs.super__Vector_base<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::vector
                  ((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_> *)
                   &attachmentRefNdx_1);
        uStack_368 = 0;
        while( true ) {
          pvVar28 = Subpass::getColorAttachments((Subpass *)renderInfo);
          sVar17 = std::
                   vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                   ::size(pvVar28);
          if (sVar17 <= uStack_368) break;
          pvVar28 = Subpass::getColorAttachments((Subpass *)renderInfo);
          pvVar23 = std::
                    vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                    ::operator[](pvVar28,uStack_368);
          dVar10 = AttachmentReference::getAttachment(pvVar23);
          pvVar16 = RenderPass::getAttachments(renderPassInfo);
          pvVar18 = std::
                    vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ::operator[](pvVar16,(ulong)dVar10);
          VVar6 = Attachment::getFormat(pvVar18);
          TVar34 = ::vk::mapVkFormat(VVar6);
          y_2 = TVar34.order;
          iVar14 = tcu::getNumUsedChannels(y_2);
          inputs.super__Vector_base<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&(inputs.
                                 super__Vector_base<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_ptr +
                        (long)iVar14);
          uStack_368 = uStack_368 + 1;
        }
        pAVar24 = Subpass::getDepthStencilAttachment((Subpass *)renderInfo);
        dVar10 = AttachmentReference::getAttachment(pAVar24);
        if (dVar10 != 0xffffffff) {
          inputs.super__Vector_base<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&(inputs.
                                 super__Vector_base<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_ptr + 1);
        }
        local_388 = tcu::Vector<int,_2>::y(&posBI);
        while( true ) {
          iVar14 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&attachmentRefNdx);
          if (iVar14 <= local_388) break;
          inputAttachmentNdx._4_4_ = tcu::Vector<int,_2>::x(&posBI);
          while( true ) {
            iVar14 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&attachmentRefNdx);
            if (iVar14 <= inputAttachmentNdx._4_4_) break;
            uStack_398 = 0;
            while( true ) {
              pvVar28 = Subpass::getInputAttachments((Subpass *)renderInfo);
              sVar17 = std::
                       vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                       ::size(pvVar28);
              if (sVar17 <= uStack_398) break;
              pvVar28 = Subpass::getInputAttachments((Subpass *)renderInfo);
              pvVar23 = std::
                        vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                        ::operator[](pvVar28,uStack_398);
              dVar10 = AttachmentReference::getAttachment(pvVar23);
              pvVar16 = RenderPass::getAttachments(renderPassInfo);
              format_8 = (TextureFormat)
                         std::
                         vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                         ::operator[](pvVar16,(ulong)dVar10);
              VVar6 = Attachment::getFormat((Attachment *)format_8);
              _compNdx_1 = ::vk::mapVkFormat(VVar6);
              local_3b4 = tcu::getNumUsedChannels(compNdx_1);
              for (local_3b8 = 0; local_3b8 < local_3b4; local_3b8 = local_3b8 + 1) {
                pvVar19 = std::
                          vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                          ::operator[](referenceAttachments,(ulong)dVar10);
                uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
                pvVar35 = std::
                          vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          ::operator[](pvVar19,(ulong)(inputAttachmentNdx._4_4_ + local_388 * uVar7)
                                      );
                PixelValue::getValue((PixelValue *)&inputsPerOutput,(size_t)pvVar35);
                std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::push_back
                          ((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_> *)
                           &attachmentRefNdx_1,(value_type *)&inputsPerOutput);
                tcu::Maybe<bool>::~Maybe((Maybe<bool> *)&inputsPerOutput);
              }
              uStack_398 = uStack_398 + 1;
            }
            pMVar36 = (pointer)std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::
                               size((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_> *)
                                    &attachmentRefNdx_1);
            if (pMVar36 < inputs.
                          super__Vector_base<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_878 = 1;
            }
            else {
              sVar17 = std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::size
                                 ((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_> *)
                                  &attachmentRefNdx_1);
              local_878 = sVar17 / (ulong)inputs.
                                          super__Vector_base<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              sVar17 = std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::size
                                 ((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_> *)
                                  &attachmentRefNdx_1);
              local_878 = local_878 +
                          (long)(int)(uint)(sVar17 % (ulong)inputs.
                                                  super__Vector_base<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           != 0);
            }
            attachmentRefNdx_2 = 0;
            uStack_3e0 = 0;
            while( true ) {
              pvVar28 = Subpass::getColorAttachments((Subpass *)renderInfo);
              sVar17 = std::
                       vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                       ::size(pvVar28);
              if (sVar17 <= uStack_3e0) break;
              pvVar28 = Subpass::getColorAttachments((Subpass *)renderInfo);
              pvVar23 = std::
                        vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                        ::operator[](pvVar28,uStack_3e0);
              dVar10 = AttachmentReference::getAttachment(pvVar23);
              pvVar16 = RenderPass::getAttachments(renderPassInfo);
              pvVar18 = std::
                        vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                        ::operator[](pvVar16,(ulong)dVar10);
              VVar6 = Attachment::getFormat(pvVar18);
              TVar34 = ::vk::mapVkFormat(VVar6);
              pvVar19 = std::
                        vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                        ::operator[](referenceAttachments,(ulong)dVar10);
              reference_7._0_4_ = TVar34.order;
              iVar14 = tcu::getNumUsedChannels((ChannelOrder)reference_7);
              for (index_3._0_4_ = 0; (int)index_3 < iVar14; index_3._0_4_ = (int)index_3 + 1) {
                sVar33 = (long)&subpass->m_pipelineBindPoint + attachmentRefNdx_2 + dVar10;
                output.field_1.m_align._4_4_ = boolOpFromIndex(sVar33);
                uStack_410 = (uint)sVar33;
                output.field_1.m_align._3_1_ = inputAttachmentNdx._4_4_ % 2 == (uStack_410 & 1);
                output.field_1.m_align._2_1_ = local_388 % 2 == (uint)((uStack_410 >> 1 & 1) != 0);
                i._7_1_ = performBoolOp(output.field_1.m_align._4_4_,
                                        (bool)output.field_1.m_align._3_1_,
                                        (bool)output.field_1.m_align._2_1_);
                tcu::just<bool>((tcu *)local_428,(bool *)((long)&i + 7));
                for (local_438 = 0; local_438 < local_878; local_438 = local_438 + 1) {
                  bVar4 = tcu::Maybe::operator_cast_to_bool((Maybe *)local_428);
                  if (!bVar4) break;
                  uVar37 = (attachmentRefNdx_2 + (long)(int)index_3) * local_878 + local_438;
                  sVar17 = std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::size
                                     ((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>
                                       *)&attachmentRefNdx_1);
                  pvVar38 = std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::
                            operator[]((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>
                                        *)&attachmentRefNdx_1,uVar37 % sVar17);
                  bVar4 = tcu::Maybe::operator_cast_to_bool((Maybe *)pvVar38);
                  if (bVar4) {
                    pbVar39 = tcu::Maybe<bool>::operator*((Maybe<bool> *)local_428);
                    bVar4 = *pbVar39;
                    uVar37 = (attachmentRefNdx_2 + (long)(int)index_3) * local_878 + local_438;
                    sVar17 = std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::size
                                       ((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>
                                         *)&attachmentRefNdx_1);
                    pvVar38 = std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::
                              operator[]((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>
                                          *)&attachmentRefNdx_1,uVar37 % sVar17);
                    pbVar39 = tcu::Maybe<bool>::operator*(pvVar38);
                    reference_8._7_1_ = (bVar4 & 1U) == (*pbVar39 & 1U);
                    tcu::Maybe<bool>::operator=
                              ((Maybe<bool> *)local_428,(bool *)((long)&reference_8 + 7));
                  }
                  else {
                    tcu::nothing<bool>();
                    tcu::Maybe<bool>::operator=
                              ((Maybe<bool> *)local_428,(Maybe<bool> *)&attachmentIndex_9);
                    tcu::Maybe<bool>::~Maybe((Maybe<bool> *)&attachmentIndex_9);
                  }
                }
                bVar4 = tcu::Maybe::operator_cast_to_bool((Maybe *)local_428);
                if (bVar4) {
                  uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
                  pvVar35 = std::
                            vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                            ::operator[](pvVar19,(ulong)(inputAttachmentNdx._4_4_ +
                                                        local_388 * uVar7));
                  pbVar39 = tcu::Maybe<bool>::operator*((Maybe<bool> *)local_428);
                  PixelValue::setValue(pvVar35,(long)(int)index_3,(bool)(*pbVar39 & 1));
                }
                else {
                  uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
                  pvVar35 = std::
                            vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                            ::operator[](pvVar19,(ulong)(inputAttachmentNdx._4_4_ +
                                                        local_388 * uVar7));
                  PixelValue::setUndefined(pvVar35,(long)(int)index_3);
                }
                tcu::Maybe<bool>::~Maybe((Maybe<bool> *)local_428);
              }
              attachmentRefNdx_2 = (long)iVar14 + attachmentRefNdx_2;
              uStack_3e0 = uStack_3e0 + 1;
            }
            pAVar24 = Subpass::getDepthStencilAttachment((Subpass *)renderInfo);
            dVar10 = AttachmentReference::getAttachment(pAVar24);
            if (dVar10 != 0xffffffff) {
              pAVar24 = Subpass::getDepthStencilAttachment((Subpass *)renderInfo);
              reference_8._0_4_ = AttachmentReference::getAttachment(pAVar24);
              pvVar19 = std::
                        vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                        ::operator[](referenceAttachments,(ulong)(deUint32)reference_8);
              sVar33 = (long)&subpass->m_pipelineBindPoint + (ulong)(deUint32)reference_8;
              output_1.field_1.m_align._4_4_ = boolOpFromIndex(sVar33);
              uStack_460 = (uint)sVar33;
              output_1.field_1.m_align._3_1_ = inputAttachmentNdx._4_4_ % 2 == (uStack_460 & 1);
              output_1.field_1.m_align._2_1_ = local_388 % 2 == (uint)((uStack_460 >> 1 & 1) != 0);
              i_1._7_1_ = performBoolOp(output_1.field_1.m_align._4_4_,
                                        (bool)output_1.field_1.m_align._3_1_,
                                        (bool)output_1.field_1.m_align._2_1_);
              tcu::just<bool>((tcu *)local_478,(bool *)((long)&i_1 + 7));
              for (local_488 = 0; local_488 < local_878; local_488 = local_488 + 1) {
                bVar4 = tcu::Maybe::operator_cast_to_bool((Maybe *)local_478);
                if (!bVar4) break;
                uVar37 = attachmentRefNdx_2 * local_878 + local_488;
                sVar17 = std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::size
                                   ((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_> *)
                                    &attachmentRefNdx_1);
                pvVar38 = std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::
                          operator[]((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_> *
                                     )&attachmentRefNdx_1,uVar37 % sVar17);
                bVar4 = tcu::Maybe::operator_cast_to_bool((Maybe *)pvVar38);
                if (bVar4) {
                  pbVar39 = tcu::Maybe<bool>::operator*((Maybe<bool> *)local_478);
                  bVar4 = *pbVar39;
                  uVar37 = attachmentRefNdx_2 * local_878 + local_488;
                  sVar17 = std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::size
                                     ((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>
                                       *)&attachmentRefNdx_1);
                  pvVar38 = std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::
                            operator[]((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>
                                        *)&attachmentRefNdx_1,uVar37 % sVar17);
                  pbVar39 = tcu::Maybe<bool>::operator*(pvVar38);
                  local_489 = (bVar4 & 1U) == (*pbVar39 & 1U);
                  tcu::Maybe<bool>::operator=((Maybe<bool> *)local_478,&local_489);
                }
                else {
                  tcu::nothing<bool>();
                  tcu::Maybe<bool>::operator=((Maybe<bool> *)local_478,(Maybe<bool> *)local_4a0);
                  tcu::Maybe<bool>::~Maybe((Maybe<bool> *)local_4a0);
                }
              }
              bVar4 = tcu::Maybe::operator_cast_to_bool((Maybe *)local_478);
              if (bVar4) {
                uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
                pvVar35 = std::
                          vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          ::operator[](pvVar19,(ulong)(inputAttachmentNdx._4_4_ + local_388 * uVar7)
                                      );
                pbVar39 = tcu::Maybe<bool>::operator*((Maybe<bool> *)local_478);
                PixelValue::setValue(pvVar35,0,(bool)(*pbVar39 & 1));
              }
              else {
                uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
                pvVar35 = std::
                          vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          ::operator[](pvVar19,(ulong)(inputAttachmentNdx._4_4_ + local_388 * uVar7)
                                      );
                PixelValue::setUndefined(pvVar35,0);
              }
              tcu::Maybe<bool>::~Maybe((Maybe<bool> *)local_478);
            }
            std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::clear
                      ((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_> *)
                       &attachmentRefNdx_1);
            inputAttachmentNdx._4_4_ = inputAttachmentNdx._4_4_ + 1;
          }
          local_388 = local_388 + 1;
        }
        pAVar24 = Subpass::getDepthStencilAttachment((Subpass *)renderInfo);
        dVar10 = AttachmentReference::getAttachment(pAVar24);
        if (dVar10 != 0xffffffff) {
          pAVar24 = Subpass::getDepthStencilAttachment((Subpass *)renderInfo);
          dVar10 = AttachmentReference::getAttachment(pAVar24);
          pvVar16 = RenderPass::getAttachments(renderPassInfo);
          pvVar18 = std::
                    vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ::operator[](pvVar16,(ulong)dVar10);
          VVar6 = Attachment::getFormat(pvVar18);
          TVar34 = ::vk::mapVkFormat(VVar6);
          pvVar19 = std::
                    vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ::operator[](referenceAttachments,(ulong)dVar10);
          reference_9._0_4_ = TVar34.order;
          bVar4 = tcu::hasStencilComponent((ChannelOrder)reference_9);
          if (bVar4) {
            index_5._4_4_ = tcu::Vector<int,_2>::y(&posBI);
            while( true ) {
              iVar14 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&attachmentRefNdx);
              if (iVar14 <= index_5._4_4_) break;
              index_5._0_4_ = tcu::Vector<int,_2>::x(&posBI);
              while( true ) {
                iVar14 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&attachmentRefNdx);
                pSVar3 = subpass;
                if (iVar14 <= (int)index_5) break;
                uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
                pvVar35 = std::
                          vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          ::operator[](pvVar19,(ulong)((int)index_5 + index_5._4_4_ * uVar7));
                PixelValue::setValue(pvVar35,1,((ulong)pSVar3 & 1) == 0);
                index_5._0_4_ = (int)index_5 + 1;
              }
              index_5._4_4_ = index_5._4_4_ + 1;
            }
          }
        }
        std::vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::~vector
                  ((vector<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_> *)
                   &attachmentRefNdx_1);
      }
    }
    subpass = (Subpass *)((long)&subpass->m_pipelineBindPoint + 1);
  } while( true );
}

Assistant:

void renderReferenceValues (vector<vector<PixelValue> >&		referenceAttachments,
							const RenderPass&					renderPassInfo,
							const UVec2&						targetSize,
							const vector<Maybe<VkClearValue> >&	imageClearValues,
							const vector<Maybe<VkClearValue> >&	renderPassClearValues,
							const vector<SubpassRenderInfo>&	subpassRenderInfo,
							const UVec2&						renderPos,
							const UVec2&						renderSize)
{
	const vector<Subpass>&	subpasses		= renderPassInfo.getSubpasses();
	vector<bool>			attachmentUsed	(renderPassInfo.getAttachments().size(), false);

	referenceAttachments.resize(renderPassInfo.getAttachments().size());

	for (size_t attachmentNdx = 0; attachmentNdx < renderPassInfo.getAttachments().size(); attachmentNdx++)
	{
		const Attachment			attachment	= renderPassInfo.getAttachments()[attachmentNdx];
		const tcu::TextureFormat	format		= mapVkFormat(attachment.getFormat());
		vector<PixelValue>&			reference	= referenceAttachments[attachmentNdx];

		reference.resize(targetSize.x() * targetSize.y());

		if (imageClearValues[attachmentNdx])
			clearReferenceValues(reference, targetSize, UVec2(0, 0), targetSize, BVec4(true), clearValueToPixelValue(*imageClearValues[attachmentNdx], format));
	}

	for (size_t subpassNdx = 0; subpassNdx < subpasses.size(); subpassNdx++)
	{
		const Subpass&						subpass				= subpasses[subpassNdx];
		const SubpassRenderInfo&			renderInfo			= subpassRenderInfo[subpassNdx];
		const vector<AttachmentReference>&	colorAttachments	= subpass.getColorAttachments();

		// Apply load op if attachment was used for the first time
		for (size_t attachmentNdx = 0; attachmentNdx < colorAttachments.size(); attachmentNdx++)
		{
			const deUint32 attachmentIndex = colorAttachments[attachmentNdx].getAttachment();

			if (!attachmentUsed[attachmentIndex])
			{
				const Attachment&			attachment	= renderPassInfo.getAttachments()[attachmentIndex];
				vector<PixelValue>&			reference	= referenceAttachments[attachmentIndex];
				const tcu::TextureFormat	format		= mapVkFormat(attachment.getFormat());

				DE_ASSERT(!tcu::hasDepthComponent(format.order));
				DE_ASSERT(!tcu::hasStencilComponent(format.order));

				if (attachment.getLoadOp() == VK_ATTACHMENT_LOAD_OP_CLEAR)
					clearReferenceValues(reference, targetSize, renderPos, renderSize, BVec4(true), clearValueToPixelValue(*renderPassClearValues[attachmentIndex], format));
				else if (attachment.getLoadOp() == VK_ATTACHMENT_LOAD_OP_DONT_CARE)
					markUndefined(reference, BVec4(true), targetSize, renderPos, renderSize);

				attachmentUsed[attachmentIndex] = true;
			}
		}

		// Apply load op to depth/stencil attachment if it was used for the first time
		if (subpass.getDepthStencilAttachment().getAttachment() != VK_ATTACHMENT_UNUSED)
		{
			const deUint32 attachmentIndex = subpass.getDepthStencilAttachment().getAttachment();

			// Apply load op if attachment was used for the first time
			if (!attachmentUsed[attachmentIndex])
			{
				const Attachment&			attachment	= renderPassInfo.getAttachments()[attachmentIndex];
				vector<PixelValue>&			reference	= referenceAttachments[attachmentIndex];
				const tcu::TextureFormat	format		= mapVkFormat(attachment.getFormat());

				if (tcu::hasDepthComponent(format.order))
				{
					if (attachment.getLoadOp() == VK_ATTACHMENT_LOAD_OP_CLEAR)
						clearReferenceValues(reference, targetSize, renderPos, renderSize, BVec4(true, false, false, false), clearValueToPixelValue(*renderPassClearValues[attachmentIndex], format));
					else if (attachment.getLoadOp() == VK_ATTACHMENT_LOAD_OP_DONT_CARE)
						markUndefined(reference, BVec4(true, false, false, false), targetSize, renderPos, renderSize);
				}

				if (tcu::hasStencilComponent(format.order))
				{
					if (attachment.getStencilLoadOp() == VK_ATTACHMENT_LOAD_OP_CLEAR)
						clearReferenceValues(reference, targetSize, renderPos, renderSize, BVec4(false, true, false, false), clearValueToPixelValue(*renderPassClearValues[attachmentIndex], format));
					else if (attachment.getStencilLoadOp() == VK_ATTACHMENT_LOAD_OP_DONT_CARE)
						markUndefined(reference, BVec4(false, true, false, false), targetSize, renderPos, renderSize);
				}

				attachmentUsed[attachmentIndex] = true;
			}
		}

		for (size_t colorClearNdx = 0; colorClearNdx < renderInfo.getColorClears().size(); colorClearNdx++)
		{
			const ColorClear&			colorClear		= renderInfo.getColorClears()[colorClearNdx];
			const UVec2					offset			= colorClear.getOffset();
			const UVec2					size			= colorClear.getSize();
			const deUint32				attachmentIndex	= subpass.getColorAttachments()[colorClearNdx].getAttachment();
			const Attachment&			attachment		= renderPassInfo.getAttachments()[attachmentIndex];
			const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());
			vector<PixelValue>&			reference		= referenceAttachments[attachmentIndex];
			VkClearValue				value;

			value.color = colorClear.getColor();

			clearReferenceValues(reference, targetSize, offset, size, BVec4(true), clearValueToPixelValue(value, format));
		}

		if (renderInfo.getDepthStencilClear())
		{
			const DepthStencilClear&	dsClear			= *renderInfo.getDepthStencilClear();
			const UVec2					offset			= dsClear.getOffset();
			const UVec2					size			= dsClear.getSize();
			const deUint32				attachmentIndex	= subpass.getDepthStencilAttachment().getAttachment();
			const Attachment&			attachment		= renderPassInfo.getAttachments()[attachmentIndex];
			const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());
			const bool					hasStencil		= tcu::hasStencilComponent(format.order);
			const bool					hasDepth		= tcu::hasDepthComponent(format.order);
			vector<PixelValue>&			reference		= referenceAttachments[attachmentIndex];
			VkClearValue				value;

			value.depthStencil.depth = dsClear.getDepth();
			value.depthStencil.stencil = dsClear.getStencil();

			clearReferenceValues(reference, targetSize, offset, size, BVec4(hasDepth, hasStencil, false, false), clearValueToPixelValue(value, format));
		}

		if (renderInfo.getRenderQuad())
		{
			const RenderQuad&	renderQuad	= *renderInfo.getRenderQuad();
			const Vec2			posA		= renderQuad.getCornerA();
			const Vec2			posB		= renderQuad.getCornerB();
			const Vec2			origin		= Vec2((float)renderInfo.getViewportOffset().x(), (float)renderInfo.getViewportOffset().y()) + Vec2((float)renderInfo.getViewportSize().x(), (float)renderInfo.getViewportSize().y()) / Vec2(2.0f);
			const Vec2			p			= Vec2((float)renderInfo.getViewportSize().x(), (float)renderInfo.getViewportSize().y()) / Vec2(2.0f);
			const IVec2			posAI		(deRoundFloatToInt32(origin.x() + (p.x() * posA.x())),
											 deRoundFloatToInt32(origin.y() + (p.y() * posA.y())));
			const IVec2			posBI		(deRoundFloatToInt32(origin.x() + (p.x() * posB.x())),
											 deRoundFloatToInt32(origin.y() + (p.y() * posB.y())));

			DE_ASSERT(posAI.x() < posBI.x());
			DE_ASSERT(posAI.y() < posBI.y());

			if (subpass.getInputAttachments().empty())
			{
				for (size_t attachmentRefNdx = 0; attachmentRefNdx < subpass.getColorAttachments().size(); attachmentRefNdx++)
				{
					const deUint32				attachmentIndex	= subpass.getColorAttachments()[attachmentRefNdx].getAttachment();
					const Attachment&			attachment		= renderPassInfo.getAttachments()[attachmentIndex];
					const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());
					const tcu::BVec4			channelMask		= tcu::getTextureFormatChannelMask(format);
					vector<PixelValue>&			reference		= referenceAttachments[attachmentIndex];

					for (int y = posAI.y(); y < (int)posBI.y(); y++)
					for (int x = posAI.x(); x < (int)posBI.x(); x++)
					{
						for (int compNdx = 0; compNdx < 4; compNdx++)
						{
							const size_t	index	= subpassNdx + attachmentIndex + compNdx;
							const BoolOp	op		= boolOpFromIndex(index);
							const bool		boolX	= x % 2 == (int)(index % 2);
							const bool		boolY	= y % 2 == (int)((index / 2) % 2);

							if (channelMask[compNdx])
								reference[x + y * targetSize.x()].setValue(compNdx, performBoolOp(op, boolX, boolY));
						}
					}
				}

				if (subpass.getDepthStencilAttachment().getAttachment() != VK_ATTACHMENT_UNUSED)
				{
					const deUint32				attachmentIndex	= subpass.getDepthStencilAttachment().getAttachment();
					const Attachment&			attachment		= renderPassInfo.getAttachments()[attachmentIndex];
					const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());
					vector<PixelValue>&			reference		= referenceAttachments[attachmentIndex];

					for (int y = posAI.y(); y < (int)posBI.y(); y++)
					for (int x = posAI.x(); x < (int)posBI.x(); x++)
					{
						if (tcu::hasDepthComponent(format.order))
						{
							const size_t	index	= subpassNdx + 1;
							const BoolOp	op		= boolOpFromIndex(index);
							const bool		boolX	= x % 2 == (int)(index % 2);
							const bool		boolY	= y % 2 == (int)((index / 2) % 2);

							reference[x + y * targetSize.x()].setValue(0, performBoolOp(op, boolX, boolY));
						}

						if (tcu::hasStencilComponent(format.order))
						{
							const size_t	index	= subpassNdx;
							reference[x + y * targetSize.x()].setValue(1, (index % 2) == 0);
						}
					}
				}
			}
			else
			{
				size_t					outputComponentCount	= 0;
				vector<Maybe<bool> >	inputs;

				DE_ASSERT(posAI.x() < posBI.x());
				DE_ASSERT(posAI.y() < posBI.y());

				for (size_t attachmentRefNdx = 0; attachmentRefNdx < subpass.getColorAttachments().size(); attachmentRefNdx++)
				{
					const deUint32				attachmentIndex	= subpass.getColorAttachments()[attachmentRefNdx].getAttachment();
					const Attachment&			attachment		= renderPassInfo.getAttachments()[attachmentIndex];
					const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());
					const int					componentCount	= tcu::getNumUsedChannels(format.order);

					outputComponentCount += (size_t)componentCount;
				}

				if (subpass.getDepthStencilAttachment().getAttachment() != VK_ATTACHMENT_UNUSED)
					outputComponentCount++;

				for (int y = posAI.y(); y < (int)posBI.y(); y++)
				for (int x = posAI.x(); x < (int)posBI.x(); x++)
				{
					for (size_t inputAttachmentNdx = 0; inputAttachmentNdx < subpass.getInputAttachments().size(); inputAttachmentNdx++)
					{
						const deUint32				attachmentIndex	= subpass.getInputAttachments()[inputAttachmentNdx].getAttachment();
						const Attachment&			attachment		= renderPassInfo.getAttachments()[attachmentIndex];
						const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());
						const int					componentCount	= tcu::getNumUsedChannels(format.order);

						for (int compNdx = 0; compNdx < componentCount; compNdx++)
							inputs.push_back(referenceAttachments[attachmentIndex][x + y * targetSize.x()].getValue(compNdx));
					}

					const size_t inputsPerOutput = inputs.size() >= outputComponentCount
													? ((inputs.size() / outputComponentCount)
														+ ((inputs.size() % outputComponentCount) != 0 ? 1 : 0))
													: 1;

					size_t outputValueNdx = 0;

					for (size_t attachmentRefNdx = 0; attachmentRefNdx < subpass.getColorAttachments().size(); attachmentRefNdx++)
					{
						const deUint32				attachmentIndex	= subpass.getColorAttachments()[attachmentRefNdx].getAttachment();
						const Attachment&			attachment		= renderPassInfo.getAttachments()[attachmentIndex];
						const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());
						vector<PixelValue>&			reference		= referenceAttachments[attachmentIndex];
						const int					componentCount	= tcu::getNumUsedChannels(format.order);

						for (int compNdx = 0; compNdx < componentCount; compNdx++)
						{
							const size_t	index	= subpassNdx + attachmentIndex + outputValueNdx;
							const BoolOp	op		= boolOpFromIndex(index);
							const bool		boolX	= x % 2 == (int)(index % 2);
							const bool		boolY	= y % 2 == (int)((index / 2) % 2);
							Maybe<bool>		output	= tcu::just(performBoolOp(op, boolX, boolY));

							for (size_t i = 0; i < inputsPerOutput; i++)
							{
								if (!output)
									break;
								else if (!inputs[((outputValueNdx + compNdx) * inputsPerOutput + i) % inputs.size()])
									output = tcu::nothing<bool>();
								else
									output = (*output) == (*inputs[((outputValueNdx + compNdx) * inputsPerOutput + i) % inputs.size()]);
							}

							if (output)
								reference[x + y * targetSize.x()].setValue(compNdx, *output);
							else
								reference[x + y * targetSize.x()].setUndefined(compNdx);
						}

						outputValueNdx += componentCount;
					}

					if (subpass.getDepthStencilAttachment().getAttachment() != VK_ATTACHMENT_UNUSED)
					{
						const deUint32		attachmentIndex	= subpass.getDepthStencilAttachment().getAttachment();
						vector<PixelValue>&	reference		= referenceAttachments[attachmentIndex];
						const size_t		index			= subpassNdx + attachmentIndex;
						const BoolOp		op				= boolOpFromIndex(index);
						const bool			boolX			= x % 2 == (int)(index % 2);
						const bool			boolY			= y % 2 == (int)((index / 2) % 2);
						Maybe<bool>			output			= tcu::just(performBoolOp(op, boolX, boolY));

						for (size_t i = 0; i < inputsPerOutput; i++)
						{
							if (!output)
								break;
							else if (inputs[(outputValueNdx * inputsPerOutput + i) % inputs.size()])
								output = (*output) == (*inputs[(outputValueNdx * inputsPerOutput + i) % inputs.size()]);
							else
								output = tcu::nothing<bool>();
						}

						if (output)
							reference[x + y * targetSize.x()].setValue(0, *output);
						else
							reference[x + y * targetSize.x()].setUndefined(0);
					}

					inputs.clear();
				}

				if (subpass.getDepthStencilAttachment().getAttachment() != VK_ATTACHMENT_UNUSED)
				{
					const deUint32				attachmentIndex	= subpass.getDepthStencilAttachment().getAttachment();
					const Attachment&			attachment		= renderPassInfo.getAttachments()[attachmentIndex];
					const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());
					vector<PixelValue>&			reference		= referenceAttachments[attachmentIndex];

					if (tcu::hasStencilComponent(format.order))
					{
						for (int y = posAI.y(); y < (int)posBI.y(); y++)
						for (int x = posAI.x(); x < (int)posBI.x(); x++)
						{
							const size_t	index	= subpassNdx;
							reference[x + y * targetSize.x()].setValue(1, (index % 2) == 0);
						}
					}
				}
			}
		}
	}

	// Mark all attachments that were used but not stored as undefined
	for (size_t attachmentIndex = 0; attachmentIndex < renderPassInfo.getAttachments().size(); attachmentIndex++)
	{
		const Attachment			attachment					= renderPassInfo.getAttachments()[attachmentIndex];
		const tcu::TextureFormat	format						= mapVkFormat(attachment.getFormat());
		vector<PixelValue>&			reference					= referenceAttachments[attachmentIndex];
		const bool					isStencilAttachment			= hasStencilComponent(format.order);
		const bool					isDepthOrStencilAttachment	= hasDepthComponent(format.order) || isStencilAttachment;

		if (attachmentUsed[attachmentIndex] && renderPassInfo.getAttachments()[attachmentIndex].getStoreOp() == VK_ATTACHMENT_STORE_OP_DONT_CARE)
		{
			if (isDepthOrStencilAttachment)
				markUndefined(reference, BVec4(true, false, false, false), targetSize, renderPos, renderSize);
			else
				markUndefined(reference, BVec4(true), targetSize, renderPos, renderSize);
		}

		if (attachmentUsed[attachmentIndex] && isStencilAttachment && renderPassInfo.getAttachments()[attachmentIndex].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_DONT_CARE)
			markUndefined(reference, BVec4(false, true, false, false), targetSize, renderPos, renderSize);
	}
}